

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::str<char_const(&)[25],unsigned_short_const&,char_const(&)[2]>
          (String *__return_storage_ptr__,kj *this,char (*params) [25],unsigned_short *params_1,
          char (*params_2) [2])

{
  char (*value) [25];
  unsigned_short *value_00;
  char (*value_01) [2];
  CappedArray<char,_8UL> local_58;
  CappedArray<char,_8UL> local_48;
  ArrayPtr<const_char> local_38;
  char (*local_28) [2];
  char (*params_local_2) [2];
  unsigned_short *params_local_1;
  char (*params_local) [25];
  
  local_28 = (char (*) [2])params_1;
  params_local_2 = (char (*) [2])params;
  params_local_1 = (unsigned_short *)this;
  params_local = (char (*) [25])__return_storage_ptr__;
  value = ::const((char (*) [25])this);
  local_38 = toCharSequence<char_const(&)[25]>(value);
  value_00 = fwd<unsigned_short_const&>((unsigned_short *)params_local_2);
  local_48 = toCharSequence<unsigned_short_const&>(value_00);
  value_01 = ::const(local_28);
  local_58 = (CappedArray<char,_8UL>)toCharSequence<char_const(&)[2]>(value_01);
  _::concat<kj::ArrayPtr<char_const>,kj::CappedArray<char,8ul>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_38,(ArrayPtr<const_char> *)&local_48,&local_58,
             (ArrayPtr<const_char> *)params_2);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}